

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall
mp::internal::AffineExprExtractor::VisitCommonExpr(AffineExprExtractor *this,Reference e)

{
  ColProblem *pCVar1;
  pointer pLVar2;
  pointer pBVar3;
  ExprBase e_00;
  int *piVar4;
  long lVar5;
  size_t index;
  ulong uVar6;
  
  pCVar1 = this->sp_->problem_;
  uVar6 = (ulong)*(int *)((long)e.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.
                                super_ExprBase.impl_ + 4);
  pLVar2 = (pCVar1->super_Problem).linear_exprs_.
           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = *(int **)&pLVar2[uVar6].terms_.
                     super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>;
  for (lVar5 = *(size_ty *)
                ((long)&pLVar2[uVar6].terms_.
                        super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + 0x10) <<
               4; lVar5 != 0; lVar5 = lVar5 + -0x10) {
    AddTerm(this,*piVar4,*(double *)(piVar4 + 2));
    piVar4 = piVar4 + 4;
  }
  pBVar3 = (pCVar1->super_Problem).nonlinear_exprs_.
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar6 < (ulong)((long)(pCVar1->super_Problem).nonlinear_exprs_.
                            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 3)) {
    e_00.impl_ = pBVar3[uVar6].super_ExprBase.impl_;
  }
  else {
    e_00.impl_ = (Impl *)0x0;
  }
  BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes> *)
             this,(Expr)e_00.impl_);
  return;
}

Assistant:

void AffineExprExtractor::VisitCommonExpr(Reference e) {
  auto common_expr = sp_.problem_.common_expr(e.index());
  const auto &linear = common_expr.linear_expr();
  for (auto i = linear.begin(), end = linear.end(); i != end; ++i)
    AddTerm(i->var_index(), i->coef());
  Visit(common_expr.nonlinear_expr());
}